

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

StringRef __thiscall Catch::trim(Catch *this,StringRef ref)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  Catch *pCVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  StringRef SVar11;
  
  pcVar8 = ref.m_start;
  pcVar1 = pcVar8;
  pcVar2 = pcVar8;
  if (pcVar8 != (char *)0x0) {
    bVar10 = true;
    pcVar3 = (char *)0x0;
    do {
      if ((0x20 < (ulong)(byte)this[(long)pcVar3]) ||
         ((0x100002600U >> ((ulong)(byte)this[(long)pcVar3] & 0x3f) & 1) == 0))
      goto joined_r0x00166d4e;
      pcVar3 = pcVar3 + 1;
      bVar10 = pcVar3 < pcVar8;
      pcVar4 = pcVar8;
      pcVar6 = pcVar8;
    } while (pcVar3 != pcVar8);
LAB_00166d88:
    uVar9 = (long)pcVar8 - (long)pcVar4;
    if ((ulong)((long)pcVar6 - (long)pcVar4) <= (ulong)((long)pcVar8 - (long)pcVar4)) {
      uVar9 = (long)pcVar6 - (long)pcVar4;
    }
    uVar7 = 0;
    if (bVar10) {
      uVar7 = uVar9;
    }
    pCVar5 = (Catch *)0x1c5ec3;
    if (bVar10) {
      pCVar5 = this + (long)pcVar4;
    }
    SVar11.m_size = uVar7;
    SVar11.m_start = (char *)pCVar5;
    return SVar11;
  }
  pcVar3 = (char *)0x0;
  bVar10 = false;
joined_r0x00166d4e:
  do {
    pcVar4 = pcVar3;
    pcVar6 = pcVar2;
    if (pcVar1 <= pcVar3) goto LAB_00166d88;
    if (pcVar8 <= pcVar1 + -1) {
      __assert_fail("index < m_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jbaldwin[P]libchain/test/catch.hpp"
                    ,0x281,"char Catch::StringRef::operator[](size_type) const");
    }
    pCVar5 = this + -1 + (long)pcVar1;
    pcVar6 = pcVar1;
    if ((0x20 < (ulong)(byte)*pCVar5) ||
       (pcVar1 = pcVar1 + -1, pcVar2 = pcVar3,
       (0x100002600U >> ((ulong)(byte)*pCVar5 & 0x3f) & 1) == 0)) goto LAB_00166d88;
  } while( true );
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }